

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O0

int dumbfile_mgetw(DUMBFILE *f)

{
  uint uVar1;
  long *in_RDI;
  int h;
  int l;
  uint local_4;
  
  if (in_RDI[2] < 0) {
    local_4 = 0xffffffff;
  }
  else {
    uVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI[1]);
    if ((int)uVar1 < 0) {
      in_RDI[2] = -1;
      local_4 = uVar1;
    }
    else {
      local_4 = (**(code **)(*in_RDI + 0x10))(in_RDI[1]);
      if ((int)local_4 < 0) {
        in_RDI[2] = -1;
      }
      else {
        in_RDI[2] = in_RDI[2] + 2;
        local_4 = local_4 | uVar1 << 8;
      }
    }
  }
  return local_4;
}

Assistant:

int DUMBEXPORT dumbfile_mgetw(DUMBFILE *f)
{
	int l, h;

	ASSERT(f);

	if (f->pos < 0)
		return -1;

	h = (*f->dfs->getc)(f->file);
	if (h < 0) {
		f->pos = -1;
		return h;
	}

	l = (*f->dfs->getc)(f->file);
	if (l < 0) {
		f->pos = -1;
		return l;
	}

	f->pos += 2;

	return l | (h << 8);
}